

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D::forward
          (Convolution1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Mat *in_RDI;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  Allocator *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 uVar2;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffec0;
  Mat *in_stack_fffffffffffffec8;
  Mat *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  Mat *in_stack_fffffffffffffee0;
  int local_10c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  Mat *in_stack_ffffffffffffff30;
  Option *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff6c;
  Mat *in_stack_ffffffffffffff70;
  Mat *in_stack_ffffffffffffff78;
  Convolution1D *in_stack_ffffffffffffff80;
  int local_4;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,0);
  this_00 = (Mat *)&stack0xffffffffffffff70;
  ncnn::Mat::Mat(this_00);
  flatten((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
          (Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(Option *)this_00);
  bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
  if (bVar1) {
    local_4 = -100;
    goto LAB_009138fc;
  }
  ncnn::Mat::Mat((Mat *)&stack0xffffffffffffff18);
  if (*(int *)((long)&in_RDI[3].elemsize + 4) == 0) {
LAB_009136f6:
    ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffec8);
    make_padding(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff6c,
                 (Option *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    if (bVar1) {
      local_4 = -100;
    }
    else {
      ncnn::Mat::create(in_RDI,CONCAT22((short)((uint)uVar2 >> 0x10),CONCAT11(bVar1,(char)uVar2)),
                        in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                        in_stack_fffffffffffffe78);
      bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
      ;
      if (bVar1) {
        local_4 = -100;
      }
      else {
        local_4 = convolution1d(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,local_10c,
                                in_stack_fffffffffffffec0,in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
                                in_stack_ffffffffffffff38);
        if (local_4 == 0) {
          local_4 = 0;
        }
      }
    }
    ncnn::Mat::~Mat((Mat *)0x9138de);
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,2);
    flatten((Mat *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
            (Mat *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(Option *)this_00);
    bVar1 = ncnn::Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    uVar2 = CONCAT13((char)((uint)uVar2 >> 0x18),CONCAT12(bVar1,(short)uVar2));
    if (!bVar1) goto LAB_009136f6;
    local_4 = -100;
  }
  ncnn::Mat::~Mat((Mat *)0x9138eb);
LAB_009138fc:
  ncnn::Mat::~Mat((Mat *)0x913909);
  return local_4;
}

Assistant:

int Convolution1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.c;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, _kernel_w, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, _num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data_flattened, bias_data_flattened, _kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}